

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_struct_ostream_operator
          (t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  string local_58;
  string local_38;
  
  bVar1 = has_custom_ostream(this,&tstruct->super_t_type);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"std::ostream& operator<<(std::ostream& out, const ",0x32);
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)CONCAT44(extraout_var,iVar2),
                        ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"& obj)",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
    t_generator::indent_abi_cxx11_(&local_38,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_38._M_dataplus._M_p,local_38._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"obj.printTo(out);",0x11);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"return out;",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_struct_ostream_operator(std::ostream& out, t_struct* tstruct) {
  if (!has_custom_ostream(tstruct)) {
    // thrift defines this behavior
    out << "std::ostream& operator<<(std::ostream& out, const "
        << tstruct->get_name()
        << "& obj)" << endl;
    scope_up(out);
    out << indent() << "obj.printTo(out);" << endl
        << indent() << "return out;" << endl;
    scope_down(out);
    out << endl;
  }
}